

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

int __thiscall
Map<unsigned_int,_Error::Private::Str>::remove
          (Map<unsigned_int,_Error::Private::Str> *this,char *__filename)

{
  Item *pIVar1;
  Item *pIVar2;
  char *pcVar3;
  usize uVar4;
  usize uVar5;
  code *pcVar6;
  int iVar7;
  Item *pIVar8;
  Item *pIVar9;
  Item *pIVar10;
  undefined8 uVar11;
  Iterator *pIVar12;
  Item *pIVar13;
  Item **ppIVar14;
  Item *pIVar15;
  
  pIVar1 = *(Item **)__filename;
  pIVar8 = pIVar1->parent;
  if (pIVar8 == (Item *)0x0) {
    ppIVar14 = &this->root;
  }
  else {
    ppIVar14 = &pIVar8->right;
    if (pIVar1 == pIVar8->left) {
      ppIVar14 = &pIVar8->left;
    }
  }
  if ((*ppIVar14 != pIVar1) &&
     (iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                            ,0xc9,"*cell == item"), iVar7 != 0)) goto LAB_0010a826;
  pIVar9 = pIVar1->left;
  pIVar13 = pIVar1->right;
  pIVar15 = pIVar8;
  if (pIVar9 == (Item *)0x0 && pIVar13 == (Item *)0x0) {
    *ppIVar14 = (Item *)0x0;
    goto LAB_0010a5e0;
  }
  if (pIVar9 == (Item *)0x0) {
    *ppIVar14 = pIVar13;
    pIVar13->parent = pIVar8;
    goto LAB_0010a5e0;
  }
  if (pIVar13 == (Item *)0x0) {
    *ppIVar14 = pIVar9;
    pIVar9->parent = pIVar8;
    goto LAB_0010a5e0;
  }
  if (pIVar9->height < pIVar13->height) {
    pIVar10 = pIVar1->next;
    if ((pIVar10->left != (Item *)0x0) &&
       (iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0xe4,"!next->left"), iVar7 != 0)) goto LAB_0010a826;
    pIVar15 = pIVar10->parent;
    if (pIVar15 == pIVar1) {
      if ((pIVar10 != pIVar13) &&
         (iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0xe8,"next == right"), iVar7 != 0)) goto LAB_0010a826;
      *ppIVar14 = pIVar10;
      pIVar10->parent = pIVar8;
      pIVar10->left = pIVar9;
      pIVar13 = pIVar9;
LAB_0010a7a5:
      pIVar13->parent = pIVar10;
      pIVar15 = pIVar10;
    }
    else {
      if ((pIVar10 != pIVar15->left) &&
         (iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0xf3,"next == nextParent->left"), iVar7 != 0)) goto LAB_0010a826;
      pIVar2 = pIVar10->right;
      pIVar15->left = pIVar2;
      if (pIVar2 != (Item *)0x0) {
        pIVar2->parent = pIVar15;
      }
      *ppIVar14 = pIVar10;
      pIVar10->parent = pIVar8;
      pIVar10->left = pIVar9;
      pIVar9->parent = pIVar10;
      pIVar10->right = pIVar13;
      pIVar13->parent = pIVar10;
      if (pIVar15 == (Item *)0x0) {
        uVar11 = 0x107;
LAB_0010a7ce:
        iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,uVar11,"parent");
        if (iVar7 != 0) {
LAB_0010a826:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
      }
    }
  }
  else {
    pIVar10 = pIVar1->prev;
    if ((pIVar10->right != (Item *)0x0) &&
       (iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x10d,"!prev->right"), iVar7 != 0)) goto LAB_0010a826;
    pIVar15 = pIVar10->parent;
    if (pIVar15 == pIVar1) {
      if ((pIVar10 != pIVar9) &&
         (iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0x111,"prev == left"), iVar7 != 0)) goto LAB_0010a826;
      *ppIVar14 = pIVar10;
      pIVar10->parent = pIVar8;
      pIVar10->right = pIVar13;
      goto LAB_0010a7a5;
    }
    if ((pIVar10 != pIVar15->right) &&
       (iVar7 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x11c,"prev == prevParent->right"), iVar7 != 0)) goto LAB_0010a826;
    pIVar2 = pIVar10->left;
    pIVar15->right = pIVar2;
    if (pIVar2 != (Item *)0x0) {
      pIVar2->parent = pIVar15;
    }
    *ppIVar14 = pIVar10;
    pIVar10->parent = pIVar8;
    pIVar10->right = pIVar13;
    pIVar13->parent = pIVar10;
    pIVar10->left = pIVar9;
    pIVar9->parent = pIVar10;
    if (pIVar15 == (Item *)0x0) {
      uVar11 = 0x130;
      goto LAB_0010a7ce;
    }
  }
  do {
    uVar4 = pIVar15->height;
    Item::updateHeightAndSlope(pIVar15);
    pIVar9 = rebal(this,pIVar15);
    uVar5 = pIVar9->height;
    if (uVar4 == uVar5) {
      pIVar9 = *ppIVar14;
      Item::updateHeightAndSlope(pIVar9);
      pIVar9 = rebal(this,pIVar9);
    }
    pIVar15 = pIVar9->parent;
  } while ((uVar4 != uVar5) && (pIVar15 != pIVar8));
LAB_0010a5e0:
  while (pIVar15 != (Item *)0x0) {
    uVar4 = pIVar15->height;
    Item::updateHeightAndSlope(pIVar15);
    pIVar8 = rebal(this,pIVar15);
    if (uVar4 == pIVar8->height) break;
    pIVar15 = pIVar8->parent;
  }
  pIVar8 = pIVar1->next;
  pIVar9 = pIVar1->prev;
  pIVar12 = (Iterator *)&pIVar9->next;
  if (pIVar9 == (Item *)0x0) {
    pIVar12 = &this->_begin;
  }
  pIVar12->item = pIVar8;
  pIVar8->prev = pIVar9;
  this->_size = this->_size - 1;
  pcVar3 = (pIVar1->value)._ptr;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  pIVar1->prev = this->freeItem;
  this->freeItem = pIVar1;
  return (int)pIVar1->next;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;
    Item* origParent;
    Item* parent = origParent = item->parent;
    Item** cell = parent ? (item == parent->left ? &parent->left : &parent->right) : &root;
    ASSERT(*cell == item);
    Item* left = item->left;
    Item* right = item->right;

    if(!left && !right)
    {
      *cell = 0;
      goto rebalParentUpwards;
    }

    if(!left)
    {
      *cell = right;
      right->parent = parent;
      goto rebalParentUpwards;
    }

    if(!right)
    {
      *cell = left;
      left->parent = parent;
      goto rebalParentUpwards;
    }

    if(left->height < right->height)
    {
      Item* next = item->next;
      ASSERT(!next->left);
      Item* nextParent = next->parent;
      if(nextParent == item)
      {
        ASSERT(next == right);
        *cell = next;
        next->parent = parent;

        next->left = left;
        left->parent = next;
        parent = next;
        goto rebalParent;
      }

      // unlink next
      ASSERT(next == nextParent->left);
      Item* nextRight = next->right;
      nextParent->left = nextRight;
      if(nextRight)
        nextRight->parent = nextParent;
      
      // put next in cell
      *cell = next;
      next->parent = parent;

      // link left to next left
      next->left = left;
      left->parent = next;

      // link right to next right
      next->right = right;
      right->parent = next;

      // rebal old next->parent
      parent = nextParent;
      ASSERT(parent);
      goto rebalParent;
    }
    else
    {
      Item* prev = item->prev;
      ASSERT(!prev->right);
      Item* prevParent = prev->parent;
      if(prevParent == item)
      {
        ASSERT(prev == left);
        *cell = prev;
        prev->parent = parent;

        prev->right = right;
        right->parent = prev;
        parent = prev;
        goto rebalParent;
      }

      // unlink prev
      ASSERT(prev == prevParent->right);
      Item* prevLeft = prev->left;
      prevParent->right = prevLeft;
      if(prevLeft)
        prevLeft->parent = prevParent;

      // put prev in cell
      *cell = prev;
      prev->parent = parent;

      // link right to prev right
      prev->right = right;
      right->parent = prev;

      // link left to prev left
      prev->left = left;
      left->parent = prev;

      // rebal old prev->parent
      parent = prevParent;
      ASSERT(parent);
      goto rebalParent;
    }

    // rebal parent upwards
  rebalParent:
    do
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
      {
        parent = *cell;
        parent->updateHeightAndSlope();
        parent = rebal(parent);
        parent = parent->parent;
        break;
      }
      parent = parent->parent;
    } while(parent != origParent);
  rebalParentUpwards:
    while(parent)
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
        break;
      parent = parent->parent;
    }

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;
    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }